

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::rpc_namedonlyparams::test_method(rpc_namedonlyparams *this)

{
  undefined1 *puVar1;
  pointer pCVar2;
  int iVar3;
  pointer pCVar4;
  RPCTestingSetup *pRVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  const_string file;
  string_view json;
  const_string file_00;
  string_view json_00;
  const_string file_01;
  string_view json_01;
  const_string file_02;
  string_view json_02;
  const_string file_03;
  const_string file_04;
  string_view json_03;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar9;
  _Vector_impl_data in_stack_fffffffffffffb08;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_490;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3f8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_3c0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_388;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_350;
  lazy_ostream local_338;
  undefined1 *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  arg_names;
  char *local_2e0;
  undefined **local_2d8 [2];
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [56];
  assertion_result local_280 [2];
  UniValue local_248;
  UniValue local_1d0;
  UniValue local_178;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [24];
  undefined1 local_c0 [32];
  undefined1 local_a0 [24];
  _Base_ptr local_88 [2];
  undefined1 local_78 [24];
  pointer local_60 [4];
  bool local_40;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"arg1","");
  local_e8._M_local_buf[8] = false;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"arg2","");
  local_c0[8] = '\0';
  local_c0._16_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"opt1","");
  local_a0[0x10] = 1;
  local_88[0] = (_Base_ptr)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"opt2","");
  local_78[0x10] = 1;
  pCVar4 = (pointer)(local_60 + 2);
  local_60[0] = pCVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"options","");
  local_40 = false;
  __l._M_len = 5;
  __l._M_array = (iterator)local_100;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&arg_names,__l,(allocator_type *)&local_178);
  lVar8 = -200;
  do {
    pCVar2 = (pointer)pCVar4[-1].nTime.__d.__r;
    if (pCVar4 != pCVar2) {
      operator_delete(pCVar2,(ulong)((long)&(((pointer)
                                             (pCVar4->super_CService).super_CNetAddr.m_addr._union.
                                             indirect_contents.indirect)->super_CService).
                                            super_CNetAddr.m_addr._union + 1));
    }
    pCVar4 = (pointer)&pCVar4[-1].super_CService.super_CNetAddr.m_addr._size;
    lVar8 = lVar8 + 0x28;
  } while (lVar8 != 0);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_308;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_318,msg);
  local_338.m_empty = false;
  local_338._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  json._M_str = "{\"arg1\": 1, \"arg2\": 2}";
  json._M_len = 0x16;
  JSON(&local_178,json);
  pRVar5 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_350,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar5);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar5,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffffb08);
  ::UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "[1,2]");
  local_280[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_280[0].m_message.px = (element_type *)0x0;
  local_280[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b8._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b8._48_8_ = "";
  local_2b8._32_8_ = local_2b8;
  puVar1 = local_2b8 + 8;
  local_2b8[0x10] = 0;
  local_2b8._8_8_ = &PTR__lazy_ostream_013d3d70;
  local_2b8._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e0;
  local_2e0 = "[1,2]";
  local_2d8[1]._0_1_ = '\0';
  local_2d8[0] = &PTR__lazy_ostream_013d4230;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_2b8._0_8_ = (CTxMemPool *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_280,&local_338,1,2,REQUIRE,0xeeb17b,(size_t)(local_2b8 + 0x28),0x77,puVar1,
             "\"[1,2]\"",local_2d8);
  boost::detail::shared_count::~shared_count(&local_280[0].m_message.pn);
  if ((_Impl *)local_120._0_8_ != (_Impl *)local_110) {
    operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._9_7_,local_100[8]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_100._9_7_,local_100[8]),local_e8._0_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_350);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x7a;
  file_00.m_begin = (iterator)&local_360;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_370,
             msg_00);
  local_338.m_empty = false;
  local_338._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  json_00._M_str = "{\"arg1\": 1, \"arg2\": 2, \"opt1\": 10, \"opt2\": 20}";
  json_00._M_len = 0x2e;
  JSON(&local_178,json_00);
  pRVar5 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_388,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar5);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar5,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffffb08);
  ::UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "[1,2,{\"opt1\":10,\"opt2\":20}]");
  local_280[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_280[0].m_message.px = (element_type *)0x0;
  local_280[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b8._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b8._48_8_ = "";
  local_2b8[0x10] = 0;
  local_2b8._8_8_ = &PTR__lazy_ostream_013d3d70;
  local_2b8._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b8._32_8_ = local_2b8;
  local_2e0 = "[1,2,{\"opt1\":10,\"opt2\":20}]";
  local_2d8[1]._0_1_ = '\0';
  local_2d8[0] = &PTR__lazy_ostream_013d6ae8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_2b8._0_8_ = (CTxMemPool *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_280,&local_338,1,2,REQUIRE,0xeeb1fe,(size_t)(local_2b8 + 0x28),0x7a,puVar1,
             "R\"([1,2,{\"opt1\":10,\"opt2\":20}])\"",local_2d8);
  boost::detail::shared_count::~shared_count(&local_280[0].m_message.pn);
  if ((__pthread_internal_list *)local_120._0_8_ != (__pthread_internal_list *)local_110) {
    operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._9_7_,local_100[8]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_100._9_7_,local_100[8]),local_e8._0_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_388);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x7d;
  file_01.m_begin = (iterator)&local_398;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3a8,
             msg_01);
  local_338.m_empty = false;
  local_338._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  json_01._M_str = "{\"arg1\": 1, \"arg2\": 2, \"options\":{\"opt1\": 10, \"opt2\": 20}}";
  json_01._M_len = 0x3a;
  JSON(&local_178,json_01);
  pRVar5 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_3c0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar5);
  RPCTestingSetup::TransformParams
            ((UniValue *)local_100,pRVar5,&local_178,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffffb08);
  ::UniValue::write_abi_cxx11_((UniValue *)local_120,(int)local_100,(void *)0x0,0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "[1,2,{\"opt1\":10,\"opt2\":20}]");
  local_280[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_280[0].m_message.px = (element_type *)0x0;
  local_280[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b8._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b8._48_8_ = "";
  local_2b8[0x10] = 0;
  local_2b8._8_8_ = &PTR__lazy_ostream_013d3d70;
  local_2b8._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b8._32_8_ = local_2b8;
  local_2e0 = "[1,2,{\"opt1\":10,\"opt2\":20}]";
  local_2d8[1]._0_1_ = '\0';
  local_2d8[0] = &PTR__lazy_ostream_013d6ae8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_2b8._0_8_ = (CTxMemPool *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (local_280,&local_338,1,2,REQUIRE,0xeeb2d4,(size_t)(local_2b8 + 0x28),0x7d,puVar1,
             "R\"([1,2,{\"opt1\":10,\"opt2\":20}])\"",local_2d8);
  boost::detail::shared_count::~shared_count(&local_280[0].m_message.pn);
  if ((__pthread_internal_list *)local_120._0_8_ != (__pthread_internal_list *)local_110) {
    operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._9_7_,local_100[8]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_100._9_7_,local_100[8]),local_e8._0_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_3c0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_178.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.val._M_dataplus._M_p != &local_178.val.field_2) {
    operator_delete(local_178.val._M_dataplus._M_p,local_178.val.field_2._M_allocated_capacity + 1);
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x81;
  file_02.m_begin = (iterator)&local_3d0;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3e0,
             msg_02);
  json_02._M_str = "{\"arg1\": 1, \"arg2\": 2, \"opt1\": 10, \"options\":{\"opt1\": 10}}";
  json_02._M_len = 0x3a;
  JSON((UniValue *)local_100,json_02);
  pRVar5 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_3f8,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar5);
  RPCTestingSetup::TransformParams
            (&local_1d0,pRVar5,(UniValue *)local_100,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffffb08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.val._M_dataplus._M_p != &local_1d0.val.field_2) {
    operator_delete(local_1d0.val._M_dataplus._M_p,
                    (ulong)(local_1d0.val.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_3f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._9_7_,local_100[8]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_100._9_7_,local_100[8]),local_e8._0_8_ + 1);
  }
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar9 = 0x560426;
  file_03.m_end = (iterator)0x81;
  file_03.m_begin = (iterator)&local_408;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_418,
             msg_03);
  local_178.typ._0_1_ = 0;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = '\0';
  local_100._0_8_ = &PTR__lazy_ostream_013d4e60;
  local_100._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_e8._0_8_ = "exception UniValue expected but not raised";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_420 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,_cVar9,
             (size_t)&local_428,0x81);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x85;
  file_04.m_begin = (iterator)&local_468;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_478,
             msg_04);
  json_03._M_str = "{\"args\": [1, 2, {\"opt1\": 10}], \"opt2\": 20}";
  json_03._M_len = 0x2a;
  JSON((UniValue *)local_100,json_03);
  pRVar5 = (RPCTestingSetup *)&arg_names;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector(&local_490,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)pRVar5);
  RPCTestingSetup::TransformParams
            (&local_248,pRVar5,(UniValue *)local_100,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              )in_stack_fffffffffffffb08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_248.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.val._M_dataplus._M_p != &local_248.val.field_2) {
    operator_delete(local_248.val._M_dataplus._M_p,
                    (ulong)(local_248.val.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&local_490);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._9_7_,local_100[8]) != &local_e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_100._9_7_,local_100[8]),(ulong)(local_e8._0_8_ + 1));
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar9 = 0x5605b6;
  file_05.m_end = (iterator)0x85;
  file_05.m_begin = (iterator)&local_4a0;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4b0,
             msg_05);
  local_178.typ._0_1_ = 0;
  local_178.val._M_dataplus._M_p = (pointer)0x0;
  local_178.val._M_string_length = 0;
  local_100[8] = '\0';
  local_100._0_8_ = &PTR__lazy_ostream_013d4e60;
  local_100._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_e8._0_8_ = "exception UniValue expected but not raised";
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_4b8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_100,1,1,WARN,_cVar9,
             (size_t)&local_4c0,0x85);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.val._M_string_length);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&arg_names);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_namedonlyparams)
{
    const std::vector<std::pair<std::string, bool>> arg_names{{"arg1", false}, {"arg2", false}, {"opt1", true}, {"opt2", true}, {"options", false}};

    // Make sure optional parameters are really optional.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2})"), arg_names).write(), "[1,2]");

    // Make sure named-only parameters are passed as options.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "opt1": 10, "opt2": 20})"), arg_names).write(), R"([1,2,{"opt1":10,"opt2":20}])");

    // Make sure options can be passed directly.
    BOOST_CHECK_EQUAL(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "options":{"opt1": 10, "opt2": 20}})"), arg_names).write(), R"([1,2,{"opt1":10,"opt2":20}])");

    // Make sure options and named parameters conflict.
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"arg1": 1, "arg2": 2, "opt1": 10, "options":{"opt1": 10}})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter options conflicts with parameter opt1"})"));

    // Make sure options object specified through args array conflicts.
    BOOST_CHECK_EXCEPTION(TransformParams(JSON(R"({"args": [1, 2, {"opt1": 10}], "opt2": 20})"), arg_names), UniValue,
                          HasJSON(R"({"code":-8,"message":"Parameter options specified twice both as positional and named argument"})"));
}